

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intrinsics.cpp
# Opt level: O0

Pass * wasm::createIntrinsicLoweringPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x130);
  memset(this,0,0x130);
  IntrinsicLowering::IntrinsicLowering((IntrinsicLowering *)this);
  return this;
}

Assistant:

Pass* createIntrinsicLoweringPass() { return new IntrinsicLowering(); }